

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::CheckCxxModuleSupport(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  cmake *pcVar2;
  ostream *poVar3;
  byte local_239;
  cmListFileBacktrace local_238;
  string local_220;
  string local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream e;
  cmListFileBacktrace local_68 [2];
  allocator<char> local_41;
  string local_40;
  byte local_19;
  cmGlobalNinjaGenerator *pcStack_18;
  bool diagnose;
  cmGlobalNinjaGenerator *this_local;
  
  local_239 = 0;
  pcStack_18 = this;
  if ((this->DiagnosedCxxModuleSupport & 1U) == 0) {
    bVar1 = cmake::GetIsInTryCompile
                      ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
    local_239 = bVar1 ^ 0xff;
  }
  local_19 = local_239 & 1;
  if (local_19 != 0) {
    this->DiagnosedCxxModuleSupport = true;
    pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "C++20 modules support via CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP is experimental.  It is meant only for compiler developers to try."
               ,&local_41);
    local_68[0].super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_68[0].super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(local_68);
    cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_40,local_68);
    cmListFileBacktrace::~cmListFileBacktrace(local_68);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  if ((this->NinjaSupportsDyndeps & 1U) == 0) {
    if ((local_19 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1e0);
      poVar3 = std::operator<<((ostream *)local_1e0,
                               "The Ninja generator does not support C++20 modules using Ninja version \n  "
                              );
      poVar3 = std::operator<<(poVar3,(string *)&this->NinjaVersion);
      poVar3 = std::operator<<(poVar3,"\ndue to lack of required features.  Ninja ");
      RequiredNinjaVersionForDyndeps_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,local_200);
      std::operator<<(poVar3," or higher is required.");
      std::__cxx11::string::~string(local_200);
      pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      std::__cxx11::ostringstream::str();
      local_238.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_238.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_238);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_220,&local_238);
      cmListFileBacktrace::~cmListFileBacktrace(&local_238);
      std::__cxx11::string::~string((string *)&local_220);
      cmSystemTools::SetFatalErrorOccurred();
      std::__cxx11::ostringstream::~ostringstream(local_1e0);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckCxxModuleSupport()
{
  bool const diagnose = !this->DiagnosedCxxModuleSupport &&
    !this->CMakeInstance->GetIsInTryCompile();
  if (diagnose) {
    this->DiagnosedCxxModuleSupport = true;
    this->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING,
      "C++20 modules support via CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP "
      "is experimental.  It is meant only for compiler developers to try.");
  }
  if (this->NinjaSupportsDyndeps) {
    return true;
  }
  if (diagnose) {
    std::ostringstream e;
    /* clang-format off */
    e <<
      "The Ninja generator does not support C++20 modules "
      "using Ninja version \n"
      "  " << this->NinjaVersion << "\n"
      "due to lack of required features.  "
      "Ninja " << RequiredNinjaVersionForDyndeps() << " or higher is required."
      ;
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccurred();
  }
  return false;
}